

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

ElOrderType Q_GetElOrder(QMatrix *Q)

{
  LASErrIdType LVar1;
  ElOrderType local_14;
  ElOrderType ElOrder;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    local_14 = Q->ElOrder;
  }
  else {
    local_14 = Rowws;
  }
  return local_14;
}

Assistant:

ElOrderType Q_GetElOrder(QMatrix *Q)
/* returns element order of the matrix Q */
{
    ElOrderType ElOrder;

    if (LASResult() == LASOK) {
        ElOrder = Q->ElOrder;
    } else {
        ElOrder = (ElOrderType)0;
    }
    return(ElOrder);
}